

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O0

void __thiscall QDomNodePrivate::normalize(QDomNodePrivate *this)

{
  QDomNodePrivate *in_stack_00000010;
  
  qNormalizeNode(in_stack_00000010);
  return;
}

Assistant:

void QDomNodePrivate::normalize()
{
    // ### This one has moved from QDomElementPrivate to this position. It is
    // not tested.
    qNormalizeNode(this);
}